

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SolverTypes.h
# Opt level: O0

void __thiscall Gluco::Clause::calcAbstraction(Clause *this)

{
  int iVar1;
  int local_18;
  uint local_14;
  int i;
  uint32_t abstraction;
  Clause *this_local;
  
  if ((*(ulong *)&this->header >> 3 & 1) != 0) {
    local_14 = 0;
    local_18 = 0;
    while( true ) {
      iVar1 = size(this);
      if (iVar1 <= local_18) break;
      iVar1 = Gluco::var((Lit)*(int *)(&this[1].header.field_0x0 + (long)local_18 * 4));
      local_14 = 1 << ((byte)iVar1 & 0x1f) | local_14;
      local_18 = local_18 + 1;
    }
    *(uint *)(&this[1].header.field_0x0 + (*(ulong *)&this->header >> 0x20) * 4) = local_14;
    return;
  }
  __assert_fail("header.has_extra",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/sat/glucose/SolverTypes.h"
                ,0xaa,"void Gluco::Clause::calcAbstraction()");
}

Assistant:

void calcAbstraction() {
        assert(header.has_extra);
        uint32_t abstraction = 0;
        for (int i = 0; i < size(); i++)
            abstraction |= 1 << (var(data[i].lit) & 31);
        data[header.size].abs = abstraction;  }